

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O2

void intern_push_heap(uint64_t **first,size_t holeIndex,size_t topIndex,uint64_t *value)

{
  ulong *puVar1;
  ulong uVar2;
  
  while (topIndex < holeIndex) {
    uVar2 = holeIndex - 1 >> 1;
    puVar1 = first[uVar2];
    if ((*puVar1 <= *value) && (puVar1 <= value || *puVar1 != *value)) break;
    first[holeIndex] = puVar1;
    holeIndex = uVar2;
  }
  first[holeIndex] = value;
  return;
}

Assistant:

static inline void
intern_push_heap (
    uint64_t** first, size_t holeIndex, size_t topIndex, uint64_t* value)
{
    size_t parent = (holeIndex - 1) / 2;
    while (holeIndex > topIndex && FHeapCompare (*(first + parent), value))
    {
        *(first + holeIndex) = *(first + parent);
        holeIndex            = parent;
        parent               = (holeIndex - 1) / 2;
    }
    *(first + holeIndex) = value;
}